

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_contains.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MapContainsBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  reference pvVar2;
  pointer pEVar3;
  pointer pEVar4;
  reference pvVar5;
  LogicalType *pLVar6;
  LogicalType *left;
  ParameterNotResolvedException *this_00;
  BinderException *this_01;
  vector<duckdb::LogicalType,_true> *pvVar7;
  LogicalType *type;
  allocator local_f9;
  LogicalType max_child_type;
  string local_e0;
  LogicalType local_c0;
  LogicalType local_a8;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  if ((pEVar3->return_type).id_ == UNKNOWN) {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  type = &pEVar3->return_type;
  pLVar6 = &pEVar4->return_type;
  if (pLVar6->id_ == UNKNOWN) {
    pvVar7 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar5 = vector<duckdb::LogicalType,_true>::get<true>(pvVar7,0);
    LogicalType::operator=(pvVar5,type);
    pLVar6 = MapType::KeyType(type);
    pvVar5 = vector<duckdb::LogicalType,_true>::get<true>(pvVar7,1);
    LogicalType::operator=(pvVar5,pLVar6);
  }
  else {
    LogicalType::LogicalType(&max_child_type);
    left = MapType::KeyType(type);
    bVar1 = LogicalType::TryGetMaxLogicalType(context,left,pLVar6,&max_child_type);
    if (!bVar1) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_e0,
                 "%s: Cannot match element of type \'%s\' in a map of type \'%s\' - an explicit cast is required"
                 ,&local_f9);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 &(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                  name);
      LogicalType::ToString_abi_cxx11_(&local_70,pLVar6);
      LogicalType::ToString_abi_cxx11_(&local_90,type);
      BinderException::
      BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_01,&local_e0,&local_50,&local_70,&local_90);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_a8,&max_child_type);
    pLVar6 = MapType::ValueType(type);
    LogicalType::LogicalType(&local_c0,pLVar6);
    LogicalType::MAP((LogicalType *)&local_e0,&local_a8,&local_c0);
    pvVar7 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar5 = vector<duckdb::LogicalType,_true>::get<true>(pvVar7,0);
    LogicalType::operator=(pvVar5,(LogicalType *)&local_e0);
    LogicalType::~LogicalType((LogicalType *)&local_e0);
    LogicalType::~LogicalType(&local_c0);
    LogicalType::~LogicalType(&local_a8);
    pvVar5 = vector<duckdb::LogicalType,_true>::get<true>(pvVar7,1);
    LogicalType::operator=(pvVar5,&max_child_type);
    LogicalType::~LogicalType(&max_child_type);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> MapContainsBind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	const auto &map = arguments[0]->return_type;
	const auto &key = arguments[1]->return_type;

	if (map.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}

	if (key.id() == LogicalTypeId::UNKNOWN) {
		// Infer the argument type from the map type
		bound_function.arguments[0] = map;
		bound_function.arguments[1] = MapType::KeyType(map);
	} else {
		LogicalType max_child_type;
		if (!LogicalType::TryGetMaxLogicalType(context, MapType::KeyType(map), key, max_child_type)) {
			throw BinderException(
			    "%s: Cannot match element of type '%s' in a map of type '%s' - an explicit cast is required",
			    bound_function.name, key.ToString(), map.ToString());
		}

		bound_function.arguments[0] = LogicalType::MAP(max_child_type, MapType::ValueType(map));
		bound_function.arguments[1] = max_child_type;
	}
	return nullptr;
}